

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_avx2.c
# Opt level: O1

void av1_dist_wtd_convolve_y_avx2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint8_t *puVar10;
  undefined1 (*pauVar11) [16];
  undefined1 (*pauVar12) [16];
  uint8_t *puVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  char cVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  uint8_t *puVar21;
  long lVar22;
  uint8_t *puVar23;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  __m128i res_0;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined2 uVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  __m256i src_ab [7];
  __m256i src_a [7];
  undefined1 (*local_410) [16];
  undefined1 local_320 [32];
  undefined1 local_2e0 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_80 [32];
  undefined1 auVar25 [32];
  
  local_410 = (undefined1 (*) [16])conv_params->dst;
  auVar27._16_16_ =
       *(undefined1 (*) [16])
        (filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * (uint)filter_params_y->taps);
  auVar27._0_16_ =
       *(undefined1 (*) [16])
        (filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * (uint)filter_params_y->taps);
  uVar6 = 8 - conv_params->round_0;
  iVar20 = (1 << ((byte)conv_params->round_1 & 0x1f)) >> 1;
  iVar18 = conv_params->round_1 + conv_params->round_0;
  cVar17 = (char)iVar18;
  iVar15 = 1 << (0x16U - cVar17 & 0x1f);
  lVar22 = (long)conv_params->dst_stride;
  uVar7 = 0xe - iVar18;
  auVar24._4_4_ = iVar20;
  auVar24._0_4_ = iVar20;
  auVar24._8_4_ = iVar20;
  auVar24._12_4_ = iVar20;
  auVar25._16_4_ = iVar20;
  auVar25._0_16_ = auVar24;
  auVar25._20_4_ = iVar20;
  auVar25._24_4_ = iVar20;
  auVar25._28_4_ = iVar20;
  uVar2 = conv_params->round_1;
  uVar40 = (undefined2)conv_params->fwd_offset;
  auVar45._2_2_ = uVar40;
  auVar45._0_2_ = uVar40;
  auVar45._4_2_ = uVar40;
  auVar45._6_2_ = uVar40;
  auVar45._8_2_ = uVar40;
  auVar45._10_2_ = uVar40;
  auVar45._12_2_ = uVar40;
  auVar45._14_2_ = uVar40;
  auVar45._16_2_ = uVar40;
  auVar45._18_2_ = uVar40;
  auVar45._20_2_ = uVar40;
  auVar45._22_2_ = uVar40;
  auVar45._24_2_ = uVar40;
  auVar45._26_2_ = uVar40;
  auVar45._28_2_ = uVar40;
  auVar45._30_2_ = uVar40;
  uVar40 = (undefined2)conv_params->bck_offset;
  auVar46._2_2_ = uVar40;
  auVar46._0_2_ = uVar40;
  auVar46._4_2_ = uVar40;
  auVar46._6_2_ = uVar40;
  auVar46._8_2_ = uVar40;
  auVar46._10_2_ = uVar40;
  auVar46._12_2_ = uVar40;
  auVar46._14_2_ = uVar40;
  auVar46._16_2_ = uVar40;
  auVar46._18_2_ = uVar40;
  auVar46._20_2_ = uVar40;
  auVar46._22_2_ = uVar40;
  auVar46._24_2_ = uVar40;
  auVar46._26_2_ = uVar40;
  auVar46._28_2_ = uVar40;
  auVar46._30_2_ = uVar40;
  auVar4 = vpunpcklwd_avx2(auVar45,auVar46);
  iVar18 = conv_params->do_average;
  iVar20 = conv_params->use_dist_wtd_comp_avg;
  auVar31._0_2_ = (undefined2)((-1 << (0x15U - cVar17 & 0x1f)) - iVar15);
  auVar31._2_2_ = auVar31._0_2_;
  auVar31._4_2_ = auVar31._0_2_;
  auVar31._6_2_ = auVar31._0_2_;
  auVar31._8_2_ = auVar31._0_2_;
  auVar31._10_2_ = auVar31._0_2_;
  auVar31._12_2_ = auVar31._0_2_;
  auVar31._14_2_ = auVar31._0_2_;
  auVar31._16_2_ = auVar31._0_2_;
  auVar31._18_2_ = auVar31._0_2_;
  auVar31._20_2_ = auVar31._0_2_;
  auVar31._22_2_ = auVar31._0_2_;
  auVar31._24_2_ = auVar31._0_2_;
  auVar31._26_2_ = auVar31._0_2_;
  auVar31._28_2_ = auVar31._0_2_;
  auVar31._30_2_ = auVar31._0_2_;
  uVar40 = (undefined2)iVar15;
  auVar52._2_2_ = uVar40;
  auVar52._0_2_ = uVar40;
  auVar52._4_2_ = uVar40;
  auVar52._6_2_ = uVar40;
  auVar52._8_2_ = uVar40;
  auVar52._10_2_ = uVar40;
  auVar52._12_2_ = uVar40;
  auVar52._14_2_ = uVar40;
  auVar52._16_2_ = uVar40;
  auVar52._18_2_ = uVar40;
  auVar52._20_2_ = uVar40;
  auVar52._22_2_ = uVar40;
  auVar52._24_2_ = uVar40;
  auVar52._26_2_ = uVar40;
  auVar52._28_2_ = uVar40;
  auVar52._30_2_ = uVar40;
  auVar28 = vpsraw_avx2(auVar27,1);
  auVar27 = vpshufb_avx2(auVar28,_DAT_00563b20);
  auVar45 = vpshufb_avx2(auVar28,_DAT_00563b40);
  auVar46 = vpshufb_avx2(auVar28,_DAT_00563b60);
  auVar28 = vpshufb_avx2(auVar28,_DAT_00563b00);
  uVar40 = (undefined2)((uint)(1 << ((byte)uVar7 & 0x1f)) >> 1);
  auVar39._2_2_ = uVar40;
  auVar39._0_2_ = uVar40;
  auVar39._4_2_ = uVar40;
  auVar39._6_2_ = uVar40;
  auVar39._8_2_ = uVar40;
  auVar39._10_2_ = uVar40;
  auVar39._12_2_ = uVar40;
  auVar39._14_2_ = uVar40;
  auVar39._16_2_ = uVar40;
  auVar39._18_2_ = uVar40;
  auVar39._20_2_ = uVar40;
  auVar39._22_2_ = uVar40;
  auVar39._24_2_ = uVar40;
  auVar39._26_2_ = uVar40;
  auVar39._28_2_ = uVar40;
  auVar39._30_2_ = uVar40;
  auVar3 = vpor_avx(auVar27._0_16_,auVar28._0_16_);
  if (auVar3._0_4_ == 0) {
    if (0 < w) {
      lVar8 = (long)src_stride;
      auVar27 = vpaddw_avx2(auVar39,auVar31);
      lVar5 = (long)dst_stride0 * 2;
      uVar16 = 0;
      pauVar11 = (undefined1 (*) [16])src;
      do {
        auVar28._0_16_ =
             ZEXT116(0) * auVar24 + ZEXT116(1) * *(undefined1 (*) [16])(src + (uVar16 - lVar8));
        auVar28._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
        lVar14 = 0;
        pauVar12 = pauVar11;
        do {
          auVar3 = *pauVar12;
          auVar34._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar28._0_16_;
          auVar34._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar3;
          auVar28._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar3;
          auVar28._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
          *(undefined1 (*) [32])(local_200 + lVar14) = auVar28;
          *(undefined1 (*) [32])(local_140 + lVar14) = auVar34;
          lVar14 = lVar14 + 0x20;
          pauVar12 = (undefined1 (*) [16])(*pauVar12 + lVar8);
        } while (lVar14 != 0x80);
        if (0 < h) {
          auVar28 = vpunpckhbw_avx2(local_100,local_e0);
          auVar39 = vpunpckhbw_avx2(local_140,local_120);
          auVar34 = vpunpcklbw_avx2(local_100,local_e0);
          auVar31 = vpunpcklbw_avx2(local_140,local_120);
          lVar14 = (uint)w - uVar16;
          lVar9 = 0;
          puVar10 = dst0;
          pauVar12 = local_410;
          puVar13 = src + lVar8 * 5;
          puVar21 = src + lVar8 * 4;
          puVar23 = dst0 + dst_stride0;
          auVar50 = ZEXT3264(local_1a0);
          do {
            auVar29 = auVar28;
            auVar28 = vpmaddubsw_avx2(auVar31,auVar45);
            auVar31 = vpmaddubsw_avx2(auVar34,auVar46);
            auVar28 = vpaddw_avx2(auVar28,auVar31);
            auVar37._8_2_ = 0x2000;
            auVar37._0_8_ = 0x2000200020002000;
            auVar37._10_2_ = 0x2000;
            auVar37._12_2_ = 0x2000;
            auVar37._14_2_ = 0x2000;
            auVar37._16_2_ = 0x2000;
            auVar37._18_2_ = 0x2000;
            auVar37._20_2_ = 0x2000;
            auVar37._22_2_ = 0x2000;
            auVar37._24_2_ = 0x2000;
            auVar37._26_2_ = 0x2000;
            auVar37._28_2_ = 0x2000;
            auVar37._30_2_ = 0x2000;
            auVar28 = vpaddw_avx2(auVar28,auVar37);
            auVar36 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar31 = vpunpcklwd_avx2(auVar28,auVar36);
            auVar31 = vpslld_avx2(auVar31,ZEXT416(uVar6));
            auVar31 = vpaddd_avx2(auVar31,auVar25);
            auVar26 = ZEXT416(uVar2);
            auVar31 = vpsrad_avx2(auVar31,auVar26);
            auVar28 = vpunpckhwd_avx2(auVar28,auVar36);
            auVar28 = vpslld_avx2(auVar28,ZEXT416(uVar6));
            auVar3 = *(undefined1 (*) [16])(puVar21 + uVar16);
            auVar28 = vpaddd_avx2(auVar28,auVar25);
            auVar28 = vpsrad_avx2(auVar28,auVar26);
            auVar1 = *(undefined1 (*) [16])(puVar13 + uVar16);
            auVar28 = vpackssdw_avx2(auVar31,auVar28);
            auVar28 = vpaddw_avx2(auVar52,auVar28);
            if (lVar14 < 0x10) {
              if (iVar18 == 0) {
                *pauVar12 = auVar28._0_16_;
                *(undefined1 (*) [16])(*pauVar12 + lVar22 * 2) = auVar28._16_16_;
              }
              else {
                auVar35._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar12 + lVar22 * 2) +
                     ZEXT116(1) * *pauVar12;
                auVar35._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar12 + lVar22 * 2);
                if (iVar20 == 0) {
                  auVar28 = vpaddw_avx2(auVar28,auVar35);
                  auVar28 = vpsraw_avx2(auVar28,1);
                }
                else {
                  auVar31 = vpunpcklwd_avx2(auVar35,auVar28);
                  auVar39 = vpunpckhwd_avx2(auVar35,auVar28);
                  auVar28 = vpmaddwd_avx2(auVar31,auVar4);
                  auVar39 = vpmaddwd_avx2(auVar39,auVar4);
                  auVar31 = vpsrad_avx2(auVar28,4);
                  auVar28 = vpsrad_avx2(auVar39,4);
                  auVar28 = vpackssdw_avx2(auVar31,auVar28);
                }
                auVar28 = vpaddw_avx2(auVar28,auVar27);
                auVar28 = vpsraw_avx2(auVar28,ZEXT416(uVar7));
                auVar28 = vpackuswb_avx2(auVar28,auVar25);
                if (lVar14 < 5) {
                  *(int *)(puVar10 + uVar16) = auVar28._0_4_;
                  *(int *)(puVar23 + uVar16) = auVar28._16_4_;
                }
                else {
                  *(long *)(puVar10 + uVar16) = auVar28._0_8_;
                  *(long *)(puVar23 + uVar16) = auVar28._16_8_;
                }
              }
            }
            else {
              auVar39 = vpmaddubsw_avx2(auVar39,auVar45);
              auVar31 = vpmaddubsw_avx2(auVar29,auVar46);
              auVar39 = vpaddw_avx2(auVar31,auVar39);
              auVar39 = vpaddw_avx2(auVar39,auVar37);
              auVar31 = vpunpcklwd_avx2(auVar39,auVar36);
              auVar31 = vpslld_avx2(auVar31,ZEXT416(uVar6));
              auVar31 = vpaddd_avx2(auVar31,auVar25);
              auVar31 = vpsrad_avx2(auVar31,auVar26);
              auVar39 = vpunpckhwd_avx2(auVar39,auVar36);
              auVar39 = vpslld_avx2(auVar39,ZEXT416(uVar6));
              auVar39 = vpaddd_avx2(auVar39,auVar25);
              auVar39 = vpsrad_avx2(auVar39,auVar26);
              auVar39 = vpackssdw_avx2(auVar31,auVar39);
              auVar39 = vpaddw_avx2(auVar52,auVar39);
              if (iVar18 == 0) {
                *pauVar12 = auVar28._0_16_;
                *(undefined1 (*) [16])(*pauVar12 + lVar22 * 2) = auVar28._16_16_;
                pauVar12[1] = auVar39._0_16_;
                *(undefined1 (*) [16])(pauVar12[1] + lVar22 * 2) = auVar39._16_16_;
              }
              else {
                auVar36._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar12 + lVar22 * 2) +
                     ZEXT116(1) * *pauVar12;
                auVar36._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar12 + lVar22 * 2);
                if (iVar20 == 0) {
                  auVar28 = vpaddw_avx2(auVar28,auVar36);
                  auVar28 = vpsraw_avx2(auVar28,1);
                }
                else {
                  auVar37 = vpunpcklwd_avx2(auVar36,auVar28);
                  auVar31 = vpunpckhwd_avx2(auVar36,auVar28);
                  auVar28 = vpmaddwd_avx2(auVar37,auVar4);
                  auVar31 = vpmaddwd_avx2(auVar31,auVar4);
                  auVar37 = vpsrad_avx2(auVar28,4);
                  auVar28 = vpsrad_avx2(auVar31,4);
                  auVar28 = vpackssdw_avx2(auVar37,auVar28);
                }
                auVar38._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(pauVar12[1] + lVar22 * 2) +
                     ZEXT116(1) * pauVar12[1];
                auVar38._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(pauVar12[1] + lVar22 * 2);
                if (iVar20 == 0) {
                  auVar39 = vpaddw_avx2(auVar39,auVar38);
                  auVar39 = vpsraw_avx2(auVar39,1);
                }
                else {
                  auVar37 = vpunpcklwd_avx2(auVar38,auVar39);
                  auVar31 = vpunpckhwd_avx2(auVar38,auVar39);
                  auVar39 = vpmaddwd_avx2(auVar37,auVar4);
                  auVar31 = vpmaddwd_avx2(auVar31,auVar4);
                  auVar37 = vpsrad_avx2(auVar39,4);
                  auVar39 = vpsrad_avx2(auVar31,4);
                  auVar39 = vpackssdw_avx2(auVar37,auVar39);
                }
                auVar28 = vpaddw_avx2(auVar27,auVar28);
                auVar31 = vpsraw_avx2(auVar28,ZEXT416(uVar7));
                auVar28 = vpaddw_avx2(auVar27,auVar39);
                auVar28 = vpsraw_avx2(auVar28,ZEXT416(uVar7));
                auVar28 = vpackuswb_avx2(auVar31,auVar28);
                *(undefined1 (*) [16])(puVar10 + uVar16) = auVar28._0_16_;
                *(undefined1 (*) [16])(puVar23 + uVar16) = auVar28._16_16_;
              }
            }
            auVar33._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar50._0_16_;
            auVar33._16_16_ = ZEXT116(0) * auVar50._16_16_ + ZEXT116(1) * auVar3;
            auVar51._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar1;
            auVar51._32_32_ = auVar50._32_32_;
            auVar51._16_16_ = ZEXT116(1) * auVar24;
            auVar43._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
            auVar43._16_16_ = ZEXT116(1) * auVar1;
            auVar39 = vpunpcklbw_avx2(auVar33,auVar43);
            auVar28 = vpunpckhbw_avx2(auVar33,auVar43);
            lVar9 = lVar9 + 2;
            pauVar12 = (undefined1 (*) [16])(*pauVar12 + lVar22 * 4);
            puVar23 = puVar23 + lVar5;
            puVar10 = puVar10 + lVar5;
            puVar21 = puVar21 + lVar8 * 2;
            puVar13 = puVar13 + lVar8 * 2;
            auVar50 = auVar51;
            auVar31 = auVar34;
            auVar34 = auVar39;
            auVar39 = auVar29;
          } while (lVar9 < h);
        }
        uVar16 = uVar16 + 0x10;
        pauVar11 = pauVar11 + 1;
        local_410 = local_410 + 2;
      } while (uVar16 < (uint)w);
    }
  }
  else if (0 < w) {
    lVar8 = (long)(int)(((filter_params_y->taps >> 1) - 1) * src_stride);
    lVar14 = (long)src_stride;
    auVar39 = vpaddw_avx2(auVar39,auVar31);
    pauVar11 = (undefined1 (*) [16])(src + (lVar14 - lVar8));
    lVar5 = (long)dst_stride0 * 2;
    uVar16 = 0;
    do {
      auVar29._0_16_ =
           ZEXT116(0) * auVar24 + ZEXT116(1) * *(undefined1 (*) [16])(src + (uVar16 - lVar8));
      auVar29._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
      lVar9 = 0x20;
      pauVar12 = pauVar11;
      do {
        auVar3 = *pauVar12;
        auVar30._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar29._0_16_;
        auVar30._16_16_ = ZEXT116(0) * auVar29._16_16_ + ZEXT116(1) * auVar3;
        auVar29._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar3;
        auVar29._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
        *(undefined1 (*) [32])(local_140 + lVar9) = auVar29;
        *(undefined1 (*) [32])(local_240 + lVar9) = auVar30;
        lVar9 = lVar9 + 0x20;
        pauVar12 = (undefined1 (*) [16])(*pauVar12 + lVar14);
      } while (lVar9 != 0xe0);
      if (0 < h) {
        local_320 = vpunpckhbw_avx2(local_1a0,local_180);
        auVar31 = vpunpckhbw_avx2(local_1e0,local_1c0);
        local_2e0 = vpunpckhbw_avx2(local_220,local_200);
        auVar37 = vpunpcklbw_avx2(local_1a0,local_180);
        auVar34 = vpunpcklbw_avx2(local_1e0,local_1c0);
        auVar51 = ZEXT3264(auVar27);
        auVar50 = ZEXT3264(auVar46);
        auVar29 = vpunpcklbw_avx2(local_220,local_200);
        lVar9 = (uint)w - uVar16;
        lVar19 = 0;
        puVar10 = dst0 + dst_stride0;
        puVar13 = src + (lVar14 * 7 - lVar8);
        pauVar12 = local_410;
        puVar21 = src + (lVar14 * 8 - lVar8);
        puVar23 = dst0;
        auVar49 = local_80;
        do {
          auVar35 = auVar34;
          auVar38 = auVar31;
          auVar43 = auVar51._0_32_;
          auVar31 = vpmaddubsw_avx2(auVar29,auVar43);
          auVar3 = *(undefined1 (*) [16])(puVar13 + uVar16);
          auVar47._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar49._0_16_;
          auVar47._16_16_ = ZEXT116(0) * auVar49._16_16_ + ZEXT116(1) * auVar3;
          auVar1 = *(undefined1 (*) [16])(puVar21 + uVar16);
          auVar48._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
          auVar48._16_16_ = ZEXT116(1) * auVar1;
          auVar36 = vpunpcklbw_avx2(auVar47,auVar48);
          auVar34 = vpmaddubsw_avx2(auVar35,auVar45);
          auVar31 = vpaddw_avx2(auVar31,auVar34);
          auVar33 = auVar50._0_32_;
          auVar34 = vpmaddubsw_avx2(auVar37,auVar33);
          auVar31 = vpaddw_avx2(auVar31,auVar34);
          auVar34 = vpmaddubsw_avx2(auVar36,auVar28);
          auVar41._8_2_ = 0x2000;
          auVar41._0_8_ = 0x2000200020002000;
          auVar41._10_2_ = 0x2000;
          auVar41._12_2_ = 0x2000;
          auVar41._14_2_ = 0x2000;
          auVar41._16_2_ = 0x2000;
          auVar41._18_2_ = 0x2000;
          auVar41._20_2_ = 0x2000;
          auVar41._22_2_ = 0x2000;
          auVar41._24_2_ = 0x2000;
          auVar41._26_2_ = 0x2000;
          auVar41._28_2_ = 0x2000;
          auVar41._30_2_ = 0x2000;
          auVar31 = vpaddw_avx2(auVar31,auVar41);
          auVar31 = vpaddw_avx2(auVar31,auVar34);
          auVar30 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar34 = vpunpcklwd_avx2(auVar31,auVar30);
          auVar34 = vpslld_avx2(auVar34,ZEXT416(uVar6));
          auVar34 = vpaddd_avx2(auVar34,auVar25);
          auVar34 = vpsrad_avx2(auVar34,ZEXT416(uVar2));
          auVar31 = vpunpckhwd_avx2(auVar31,auVar30);
          auVar31 = vpslld_avx2(auVar31,ZEXT416(uVar6));
          auVar31 = vpaddd_avx2(auVar31,auVar25);
          auVar31 = vpsrad_avx2(auVar31,ZEXT416(uVar2));
          auVar29 = vpunpckhbw_avx2(auVar47,auVar48);
          auVar31 = vpackssdw_avx2(auVar34,auVar31);
          auVar31 = vpaddw_avx2(auVar52,auVar31);
          if (lVar9 < 0x10) {
            if (iVar18 == 0) {
              *pauVar12 = auVar31._0_16_;
              *(undefined1 (*) [16])(*pauVar12 + lVar22 * 2) = auVar31._16_16_;
              auVar50 = ZEXT3264(auVar46);
              auVar51 = ZEXT3264(auVar27);
            }
            else {
              auVar32._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar12 + lVar22 * 2) +
                   ZEXT116(1) * *pauVar12;
              auVar32._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar12 + lVar22 * 2);
              auVar50 = ZEXT3264(auVar46);
              auVar51 = ZEXT3264(auVar27);
              if (iVar20 == 0) {
                auVar31 = vpaddw_avx2(auVar31,auVar32);
                auVar31 = vpsraw_avx2(auVar31,1);
              }
              else {
                auVar33 = vpunpcklwd_avx2(auVar32,auVar31);
                auVar34 = vpunpckhwd_avx2(auVar32,auVar31);
                auVar31 = vpmaddwd_avx2(auVar33,auVar4);
                auVar34 = vpmaddwd_avx2(auVar34,auVar4);
                auVar33 = vpsrad_avx2(auVar31,4);
                auVar31 = vpsrad_avx2(auVar34,4);
                auVar31 = vpackssdw_avx2(auVar33,auVar31);
              }
              auVar31 = vpaddw_avx2(auVar31,auVar39);
              auVar31 = vpsraw_avx2(auVar31,ZEXT416(uVar7));
              auVar31 = vpackuswb_avx2(auVar31,auVar25);
              if (lVar9 < 5) {
                *(int *)(puVar23 + uVar16) = auVar31._0_4_;
                *(int *)(puVar10 + uVar16) = auVar31._16_4_;
              }
              else {
                *(long *)(puVar23 + uVar16) = auVar31._0_8_;
                *(long *)(puVar10 + uVar16) = auVar31._16_8_;
              }
            }
          }
          else {
            auVar34 = vpmaddubsw_avx2(local_2e0,auVar43);
            auVar49 = vpmaddubsw_avx2(auVar38,auVar45);
            auVar34 = vpaddw_avx2(auVar34,auVar49);
            auVar49 = vpmaddubsw_avx2(local_320,auVar33);
            auVar34 = vpaddw_avx2(auVar34,auVar49);
            auVar49 = vpmaddubsw_avx2(auVar29,auVar28);
            auVar34 = vpaddw_avx2(auVar34,auVar41);
            auVar34 = vpaddw_avx2(auVar34,auVar49);
            auVar49 = vpunpcklwd_avx2(auVar34,auVar30);
            auVar49 = vpslld_avx2(auVar49,ZEXT416(uVar6));
            auVar49 = vpaddd_avx2(auVar49,auVar25);
            auVar49 = vpsrad_avx2(auVar49,ZEXT416(uVar2));
            auVar34 = vpunpckhwd_avx2(auVar34,auVar30);
            auVar34 = vpslld_avx2(auVar34,ZEXT416(uVar6));
            auVar34 = vpaddd_avx2(auVar34,auVar25);
            auVar34 = vpsrad_avx2(auVar34,ZEXT416(uVar2));
            auVar34 = vpackssdw_avx2(auVar49,auVar34);
            auVar34 = vpaddw_avx2(auVar52,auVar34);
            auVar50 = ZEXT3264(auVar33);
            auVar51 = ZEXT3264(auVar43);
            if (iVar18 == 0) {
              *pauVar12 = auVar31._0_16_;
              *(undefined1 (*) [16])(*pauVar12 + lVar22 * 2) = auVar31._16_16_;
              pauVar12[1] = auVar34._0_16_;
              *(undefined1 (*) [16])(pauVar12[1] + lVar22 * 2) = auVar34._16_16_;
            }
            else {
              auVar42._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar12 + lVar22 * 2) +
                   ZEXT116(1) * *pauVar12;
              auVar42._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar12 + lVar22 * 2);
              if (iVar20 == 0) {
                auVar31 = vpaddw_avx2(auVar31,auVar42);
                auVar31 = vpsraw_avx2(auVar31,1);
              }
              else {
                auVar43 = vpunpcklwd_avx2(auVar42,auVar31);
                auVar33 = vpunpckhwd_avx2(auVar42,auVar31);
                auVar31 = vpmaddwd_avx2(auVar43,auVar4);
                auVar33 = vpmaddwd_avx2(auVar33,auVar4);
                auVar43 = vpsrad_avx2(auVar31,4);
                auVar31 = vpsrad_avx2(auVar33,4);
                auVar31 = vpackssdw_avx2(auVar43,auVar31);
              }
              auVar44._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(pauVar12[1] + lVar22 * 2) +
                   ZEXT116(1) * pauVar12[1];
              auVar44._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(pauVar12[1] + lVar22 * 2);
              if (iVar20 == 0) {
                auVar34 = vpaddw_avx2(auVar34,auVar44);
                auVar34 = vpsraw_avx2(auVar34,1);
              }
              else {
                auVar43 = vpunpcklwd_avx2(auVar44,auVar34);
                auVar33 = vpunpckhwd_avx2(auVar44,auVar34);
                auVar34 = vpmaddwd_avx2(auVar43,auVar4);
                auVar33 = vpmaddwd_avx2(auVar33,auVar4);
                auVar43 = vpsrad_avx2(auVar34,4);
                auVar34 = vpsrad_avx2(auVar33,4);
                auVar34 = vpackssdw_avx2(auVar43,auVar34);
              }
              auVar31 = vpaddw_avx2(auVar39,auVar31);
              auVar33 = vpsraw_avx2(auVar31,ZEXT416(uVar7));
              auVar31 = vpaddw_avx2(auVar39,auVar34);
              auVar31 = vpsraw_avx2(auVar31,ZEXT416(uVar7));
              auVar31 = vpackuswb_avx2(auVar33,auVar31);
              *(undefined1 (*) [16])(puVar23 + uVar16) = auVar31._0_16_;
              *(undefined1 (*) [16])(puVar10 + uVar16) = auVar31._16_16_;
            }
          }
          auVar49._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar1;
          auVar49._16_16_ = ZEXT116(1) * auVar24;
          lVar19 = lVar19 + 2;
          pauVar12 = (undefined1 (*) [16])(*pauVar12 + lVar22 * 4);
          puVar10 = puVar10 + lVar5;
          puVar23 = puVar23 + lVar5;
          puVar13 = puVar13 + lVar14 * 2;
          puVar21 = puVar21 + lVar14 * 2;
          auVar31 = local_320;
          local_320 = auVar29;
          local_2e0 = auVar38;
          auVar34 = auVar37;
          auVar37 = auVar36;
          auVar29 = auVar35;
        } while (lVar19 < h);
      }
      uVar16 = uVar16 + 0x10;
      pauVar11 = pauVar11 + 1;
      local_410 = local_410 + 2;
    } while (uVar16 < (uint)w);
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_y_avx2(const uint8_t *src, int src_stride,
                                  uint8_t *dst0, int dst_stride0, int w, int h,
                                  const InterpFilterParams *filter_params_y,
                                  const int subpel_y_qn,
                                  ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int bd = 8;
  int i, j, is_vert_4tap = 0;
  // +1 to compensate for dividing the filter coeffs by 2
  const int left_shift = FILTER_BITS - conv_params->round_0 + 1;
  const __m256i round_const =
      _mm256_set1_epi32((1 << conv_params->round_1) >> 1);
  const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_1);
  const __m256i wt = unpack_weights_avx2(conv_params);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi16(offset);
  const int offset_1 = (1 << (bd + FILTER_BITS - 2));
  const __m256i offset_const_1 = _mm256_set1_epi16(offset_1);
  const __m256i offset_const_2 = _mm256_set1_epi16((1 << offset_0));
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi16((1 << rounding_shift) >> 1);
  const __m256i zero = _mm256_setzero_si256();
  __m256i coeffs[4], s[8];

  assert((FILTER_BITS - conv_params->round_0) >= 0);

  prepare_coeffs_lowbd(filter_params_y, subpel_y_qn, coeffs);

  // Condition for checking valid vert_filt taps
  if (!(_mm256_extract_epi32(_mm256_or_si256(coeffs[0], coeffs[3]), 0)))
    is_vert_4tap = 1;

  if (is_vert_4tap) {
    const int fo_vert = 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride;
    for (j = 0; j < w; j += 16) {
      const uint8_t *data = &src_ptr[j];
      __m256i src4;
      // Load lines a and b. Line a to lower 128, line b to upper 128
      {
        __m256i src_ab[4];
        __m256i src_a[5];
        src_a[0] = _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
        for (int kk = 0; kk < 4; ++kk) {
          data += src_stride;
          src_a[kk + 1] =
              _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
          src_ab[kk] =
              _mm256_permute2x128_si256(src_a[kk], src_a[kk + 1], 0x20);
        }
        src4 = src_a[4];
        s[0] = _mm256_unpacklo_epi8(src_ab[0], src_ab[1]);
        s[1] = _mm256_unpacklo_epi8(src_ab[2], src_ab[3]);

        s[3] = _mm256_unpackhi_epi8(src_ab[0], src_ab[1]);
        s[4] = _mm256_unpackhi_epi8(src_ab[2], src_ab[3]);
      }

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[(i + 5) * src_stride + j];
        const __m256i src5 =
            _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
        const __m256i src_45a = _mm256_permute2x128_si256(src4, src5, 0x20);

        src4 = _mm256_castsi128_si256(
            _mm_loadu_si128((__m128i *)(data + src_stride)));
        const __m256i src_56a = _mm256_permute2x128_si256(src5, src4, 0x20);

        s[2] = _mm256_unpacklo_epi8(src_45a, src_56a);
        s[5] = _mm256_unpackhi_epi8(src_45a, src_56a);

        __m256i res_lo = convolve_lowbd_4tap(s, coeffs + 1);

        res_lo = _mm256_add_epi16(res_lo, offset_const_1);

        const __m256i res_lo_0_32b = _mm256_unpacklo_epi16(res_lo, zero);
        const __m256i res_lo_0_shift =
            _mm256_slli_epi32(res_lo_0_32b, left_shift);
        const __m256i res_lo_0_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_lo_0_shift, round_const), round_shift);

        const __m256i res_lo_1_32b = _mm256_unpackhi_epi16(res_lo, zero);
        const __m256i res_lo_1_shift =
            _mm256_slli_epi32(res_lo_1_32b, left_shift);
        const __m256i res_lo_1_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_lo_1_shift, round_const), round_shift);

        const __m256i res_lo_round =
            _mm256_packs_epi32(res_lo_0_round, res_lo_1_round);

        const __m256i res_lo_unsigned =
            _mm256_add_epi16(res_lo_round, offset_const_2);

        if (w - j < 16) {
          if (do_average) {
            const __m256i data_ref_0 =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);
            const __m256i comp_avg_res = comp_avg(&data_ref_0, &res_lo_unsigned,
                                                  &wt, use_dist_wtd_comp_avg);

            const __m256i round_result = convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result, round_result);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            if (w - j > 4) {
              _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
              _mm_storel_epi64(
                  (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])),
                  res_1);
            } else {
              *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
              *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                  _mm_cvtsi128_si32(res_1);
            }
          } else {
            const __m128i res_0 = _mm256_castsi256_si128(res_lo_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

            const __m128i res_1 = _mm256_extracti128_si256(res_lo_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        } else {
          __m256i res_hi = convolve_lowbd_4tap(s + 3, coeffs + 1);

          res_hi = _mm256_add_epi16(res_hi, offset_const_1);

          const __m256i res_hi_0_32b = _mm256_unpacklo_epi16(res_hi, zero);
          const __m256i res_hi_0_shift =
              _mm256_slli_epi32(res_hi_0_32b, left_shift);
          const __m256i res_hi_0_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_hi_0_shift, round_const), round_shift);

          const __m256i res_hi_1_32b = _mm256_unpackhi_epi16(res_hi, zero);
          const __m256i res_hi_1_shift =
              _mm256_slli_epi32(res_hi_1_32b, left_shift);
          const __m256i res_hi_1_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_hi_1_shift, round_const), round_shift);

          const __m256i res_hi_round =
              _mm256_packs_epi32(res_hi_0_round, res_hi_1_round);

          const __m256i res_hi_unsigned =
              _mm256_add_epi16(res_hi_round, offset_const_2);

          if (do_average) {
            const __m256i data_ref_0_lo =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);

            const __m256i data_ref_0_hi =
                load_line2_avx2(&dst[i * dst_stride + j + 8],
                                &dst[i * dst_stride + j + 8 + dst_stride]);

            const __m256i comp_avg_res_lo = comp_avg(
                &data_ref_0_lo, &res_lo_unsigned, &wt, use_dist_wtd_comp_avg);

            const __m256i comp_avg_res_hi = comp_avg(
                &data_ref_0_hi, &res_hi_unsigned, &wt, use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                convolve_rounding(&comp_avg_res_lo, &offset_const,
                                  &rounding_const, rounding_shift);

            const __m256i round_result_hi =
                convolve_rounding(&comp_avg_res_hi, &offset_const,
                                  &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result_lo, round_result_hi);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);

          } else {
            const __m128i res_lo_0 = _mm256_castsi256_si128(res_lo_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_lo_0);

            const __m128i res_lo_1 =
                _mm256_extracti128_si256(res_lo_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_lo_1);

            const __m128i res_hi_0 = _mm256_castsi256_si128(res_hi_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + 8]),
                            res_hi_0);

            const __m128i res_hi_1 =
                _mm256_extracti128_si256(res_hi_unsigned, 1);
            _mm_store_si128(
                (__m128i *)(&dst[i * dst_stride + j + 8 + dst_stride]),
                res_hi_1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];

        s[3] = s[4];
        s[4] = s[5];
      }
    }
  } else {
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride;
    for (j = 0; j < w; j += 16) {
      const uint8_t *data = &src_ptr[j];
      __m256i src6;
      // Load lines a and b. Line a to lower 128, line b to upper 128
      {
        __m256i src_ab[7];
        __m256i src_a[7];
        src_a[0] = _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
        for (int kk = 0; kk < 6; ++kk) {
          data += src_stride;
          src_a[kk + 1] =
              _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
          src_ab[kk] =
              _mm256_permute2x128_si256(src_a[kk], src_a[kk + 1], 0x20);
        }
        src6 = src_a[6];
        s[0] = _mm256_unpacklo_epi8(src_ab[0], src_ab[1]);
        s[1] = _mm256_unpacklo_epi8(src_ab[2], src_ab[3]);
        s[2] = _mm256_unpacklo_epi8(src_ab[4], src_ab[5]);
        s[4] = _mm256_unpackhi_epi8(src_ab[0], src_ab[1]);
        s[5] = _mm256_unpackhi_epi8(src_ab[2], src_ab[3]);
        s[6] = _mm256_unpackhi_epi8(src_ab[4], src_ab[5]);
      }

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[(i + 7) * src_stride + j];
        const __m256i src7 =
            _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
        const __m256i src_67a = _mm256_permute2x128_si256(src6, src7, 0x20);

        src6 = _mm256_castsi128_si256(
            _mm_loadu_si128((__m128i *)(data + src_stride)));
        const __m256i src_78a = _mm256_permute2x128_si256(src7, src6, 0x20);

        s[3] = _mm256_unpacklo_epi8(src_67a, src_78a);
        s[7] = _mm256_unpackhi_epi8(src_67a, src_78a);

        __m256i res_lo = convolve_lowbd(s, coeffs);

        res_lo = _mm256_add_epi16(res_lo, offset_const_1);

        const __m256i res_lo_0_32b = _mm256_unpacklo_epi16(res_lo, zero);
        const __m256i res_lo_0_shift =
            _mm256_slli_epi32(res_lo_0_32b, left_shift);
        const __m256i res_lo_0_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_lo_0_shift, round_const), round_shift);

        const __m256i res_lo_1_32b = _mm256_unpackhi_epi16(res_lo, zero);
        const __m256i res_lo_1_shift =
            _mm256_slli_epi32(res_lo_1_32b, left_shift);
        const __m256i res_lo_1_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_lo_1_shift, round_const), round_shift);

        const __m256i res_lo_round =
            _mm256_packs_epi32(res_lo_0_round, res_lo_1_round);

        const __m256i res_lo_unsigned =
            _mm256_add_epi16(res_lo_round, offset_const_2);

        if (w - j < 16) {
          if (do_average) {
            const __m256i data_ref_0 =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);
            const __m256i comp_avg_res = comp_avg(&data_ref_0, &res_lo_unsigned,
                                                  &wt, use_dist_wtd_comp_avg);

            const __m256i round_result = convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result, round_result);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            if (w - j > 4) {
              _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
              _mm_storel_epi64(
                  (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])),
                  res_1);
            } else {
              *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
              *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                  _mm_cvtsi128_si32(res_1);
            }
          } else {
            const __m128i res_0 = _mm256_castsi256_si128(res_lo_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

            const __m128i res_1 = _mm256_extracti128_si256(res_lo_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        } else {
          __m256i res_hi = convolve_lowbd(s + 4, coeffs);

          res_hi = _mm256_add_epi16(res_hi, offset_const_1);

          const __m256i res_hi_0_32b = _mm256_unpacklo_epi16(res_hi, zero);
          const __m256i res_hi_0_shift =
              _mm256_slli_epi32(res_hi_0_32b, left_shift);
          const __m256i res_hi_0_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_hi_0_shift, round_const), round_shift);

          const __m256i res_hi_1_32b = _mm256_unpackhi_epi16(res_hi, zero);
          const __m256i res_hi_1_shift =
              _mm256_slli_epi32(res_hi_1_32b, left_shift);
          const __m256i res_hi_1_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_hi_1_shift, round_const), round_shift);

          const __m256i res_hi_round =
              _mm256_packs_epi32(res_hi_0_round, res_hi_1_round);

          const __m256i res_hi_unsigned =
              _mm256_add_epi16(res_hi_round, offset_const_2);

          if (do_average) {
            const __m256i data_ref_0_lo =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);

            const __m256i data_ref_0_hi =
                load_line2_avx2(&dst[i * dst_stride + j + 8],
                                &dst[i * dst_stride + j + 8 + dst_stride]);

            const __m256i comp_avg_res_lo = comp_avg(
                &data_ref_0_lo, &res_lo_unsigned, &wt, use_dist_wtd_comp_avg);

            const __m256i comp_avg_res_hi = comp_avg(
                &data_ref_0_hi, &res_hi_unsigned, &wt, use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                convolve_rounding(&comp_avg_res_lo, &offset_const,
                                  &rounding_const, rounding_shift);

            const __m256i round_result_hi =
                convolve_rounding(&comp_avg_res_hi, &offset_const,
                                  &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result_lo, round_result_hi);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);

          } else {
            const __m128i res_lo_0 = _mm256_castsi256_si128(res_lo_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_lo_0);

            const __m128i res_lo_1 =
                _mm256_extracti128_si256(res_lo_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_lo_1);

            const __m128i res_hi_0 = _mm256_castsi256_si128(res_hi_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + 8]),
                            res_hi_0);

            const __m128i res_hi_1 =
                _mm256_extracti128_si256(res_hi_unsigned, 1);
            _mm_store_si128(
                (__m128i *)(&dst[i * dst_stride + j + 8 + dst_stride]),
                res_hi_1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}